

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSense.c
# Opt level: O2

Vec_Int_t * Abc_NtkSensitivity(Abc_Ntk_t *pNtk,int nConfLim,int fVerbose)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *p;
  int *piVar3;
  ProgressBar *p_00;
  uint uVar4;
  int i;
  uint i_00;
  Abc_Ntk_t *pMiter;
  int local_94;
  Vec_Int_t *local_90;
  Prove_Params_t Params;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcSense.c"
                  ,0xa8,"Vec_Int_t *Abc_NtkSensitivity(Abc_Ntk_t *, int, int)");
  }
  local_94 = fVerbose;
  if (pNtk->nObjCounts[8] != 0) {
    __assert_fail("Abc_NtkLatchNum(pNtk) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcSense.c"
                  ,0xa9,"Vec_Int_t *Abc_NtkSensitivity(Abc_Ntk_t *, int, int)");
  }
  Prove_ParamsSetDefault(&Params);
  Params.nItersMax = 3;
  Params.nMiteringLimitLast = nConfLim;
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar3 = (int *)malloc(400);
  p->pArray = piVar3;
  p_00 = Extra_ProgressBarStart(_stdout,pNtk->vCis->nSize);
  i = 0;
  local_90 = p;
  do {
    if (pNtk->vCis->nSize <= i) {
      Extra_ProgressBarStop(p_00);
      if (local_94 != 0) {
        uVar4 = p->nSize;
        printf("The outputs are sensitive to %d (out of %d) inputs:\n",(ulong)uVar4,
               (ulong)(uint)pNtk->vCis->nSize);
        if ((int)uVar4 < 1) {
          uVar4 = 0;
        }
        for (i_00 = 0; uVar4 != i_00; i_00 = i_00 + 1) {
          uVar2 = Vec_IntEntry(p,i_00);
          printf("%d ",(ulong)uVar2);
        }
        putchar(10);
      }
      return p;
    }
    Abc_NtkCi(pNtk,i);
    if ((p_00 == (ProgressBar *)0x0) || (p_00->nItemsNext <= i)) {
      Extra_ProgressBarUpdate_int(p_00,i,(char *)0x0);
    }
    pMiter = Abc_NtkSensitivityMiter(pNtk,i);
    iVar1 = Abc_NtkIvyProve(&pMiter,&Params);
    if (iVar1 == -1) {
LAB_002b6b7e:
      Vec_IntPush(p,i);
    }
    else if (iVar1 == 0) {
      piVar3 = Abc_NtkVerifySimulatePattern(pMiter,pMiter->pModel);
      if (*piVar3 != 1) {
        puts("ERROR in Abc_NtkMiterProve(): Generated counter-example is invalid.");
      }
      free(piVar3);
      p = local_90;
      goto LAB_002b6b7e;
    }
    Abc_NtkDelete(pMiter);
    i = i + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Abc_NtkSensitivity( Abc_Ntk_t * pNtk, int nConfLim, int fVerbose )
{
    ProgressBar * pProgress;
    Prove_Params_t Params, * pParams = &Params;
    Vec_Int_t * vResult = NULL;
    Abc_Ntk_t * pMiter;
    Abc_Obj_t * pObj;
    int RetValue, i;
    assert( Abc_NtkIsStrash(pNtk) );
    assert( Abc_NtkLatchNum(pNtk) == 0 );
    // set up solving parameters
    Prove_ParamsSetDefault( pParams );
    pParams->nItersMax = 3;
    pParams->nMiteringLimitLast = nConfLim;
    // iterate through the PIs
    vResult = Vec_IntAlloc( 100 );
    pProgress = Extra_ProgressBarStart( stdout, Abc_NtkCiNum(pNtk) );
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        // generate the sensitivity miter
        pMiter = Abc_NtkSensitivityMiter( pNtk, i );
        // solve the miter using CEC engine
        RetValue = Abc_NtkIvyProve( &pMiter, pParams );
        if ( RetValue == -1 ) // undecided
            Vec_IntPush( vResult, i );
        else if ( RetValue == 0 )
        {
            int * pSimInfo = Abc_NtkVerifySimulatePattern( pMiter, pMiter->pModel );
            if ( pSimInfo[0] != 1 )
                printf( "ERROR in Abc_NtkMiterProve(): Generated counter-example is invalid.\n" );
//            else
//                printf( "Networks are NOT EQUIVALENT.\n" );
            ABC_FREE( pSimInfo );
            Vec_IntPush( vResult, i );
        }
        Abc_NtkDelete( pMiter );
    }
    Extra_ProgressBarStop( pProgress );
    if ( fVerbose )
    {
        printf( "The outputs are sensitive to %d (out of %d) inputs:\n", 
            Vec_IntSize(vResult), Abc_NtkCiNum(pNtk) );
        Vec_IntForEachEntry( vResult, RetValue, i )
            printf( "%d ", RetValue );
        printf( "\n" );
    }
    return vResult;
}